

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  u8 *pCell;
  u8 *pData;
  u8 *pTmp;
  u8 *pCellptr;
  int i;
  u8 *pEnd;
  int usableSize;
  u8 *aData;
  int hdr;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_58;
  int local_4c;
  
  uVar2 = (uint)*(byte *)(in_RDI + 9);
  puVar1 = *(undefined1 **)(in_RDI + 0x50);
  iVar4 = *(int *)(*(long *)(in_RDI + 0x48) + 0x34);
  local_58 = *(undefined1 **)(in_RDI + 0x60);
  pvVar5 = sqlite3PagerTempSpace((Pager *)**(undefined8 **)(in_RDI + 0x48));
  uVar3 = (uint)CONCAT11(puVar1[(int)(uVar2 + 5)],puVar1[(long)(int)(uVar2 + 5) + 1]);
  memcpy((void *)((long)pvVar5 + (long)(int)uVar3),puVar1 + (int)uVar3,(long)(int)(iVar4 - uVar3));
  local_4c = 0;
  local_68 = puVar1 + iVar4;
  while( true ) {
    if (in_ESI <= local_4c) {
      *(short *)(in_RDI + 0x16) = (short)in_ESI;
      *(undefined1 *)(in_RDI + 0xc) = 0;
      puVar1[(int)(uVar2 + 1)] = 0;
      puVar1[(long)(int)(uVar2 + 1) + 1] = 0;
      puVar1[(int)(uVar2 + 3)] = (char)((ushort)*(undefined2 *)(in_RDI + 0x16) >> 8);
      puVar1[(long)(int)(uVar2 + 3) + 1] = (char)*(undefined2 *)(in_RDI + 0x16);
      puVar1[(int)(uVar2 + 5)] = (char)((ulong)((long)local_68 - (long)puVar1) >> 8);
      puVar1[(long)(int)(uVar2 + 5) + 1] = (char)local_68 - (char)puVar1;
      puVar1[(int)(uVar2 + 7)] = 0;
      return 0;
    }
    local_70 = *(undefined1 **)(in_RDX + (long)local_4c * 8);
    if ((puVar1 <= local_70) && (local_70 < puVar1 + iVar4)) {
      local_70 = (undefined1 *)((long)pvVar5 + ((long)local_70 - (long)puVar1));
    }
    local_68 = local_68 + -(long)(int)(uint)*(ushort *)(in_RCX + (long)local_4c * 2);
    *local_58 = (char)((ulong)((long)local_68 - (long)puVar1) >> 8);
    local_58[1] = (char)local_68 - (char)puVar1;
    local_58 = local_58 + 2;
    if (local_68 < local_58) break;
    memcpy(local_68,local_70,(ulong)*(ushort *)(in_RCX + (long)local_4c * 2));
    local_4c = local_4c + 1;
  }
  iVar4 = sqlite3CorruptError(0);
  return iVar4;
}

Assistant:

static int rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, szCell[i]);
    assert( szCell[i]==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( szCell[i]!=pPg->xCellSize(pPg,pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}